

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_inspect_chunk(LodePNGState *state,size_t pos,uchar *in,size_t insize)

{
  byte *data;
  uchar uVar1;
  uint uVar2;
  ulong chunkLength;
  uchar *buffer;
  
  if (insize < pos + 4) {
    return 0x1e;
  }
  buffer = in + pos;
  uVar2 = lodepng_read32bitInt(buffer);
  if ((int)uVar2 < 0) {
    return 0x3f;
  }
  chunkLength = (ulong)uVar2;
  if (in + insize < buffer + chunkLength + 0xc) {
    return 0x1e;
  }
  data = buffer + 8;
  uVar1 = lodepng_chunk_type_equals(buffer,"PLTE");
  if (uVar1 == '\0') {
    uVar1 = lodepng_chunk_type_equals(buffer,"tRNS");
    if (uVar1 == '\0') {
      uVar1 = lodepng_chunk_type_equals(buffer,"bKGD");
      if (uVar1 == '\0') {
        uVar1 = lodepng_chunk_type_equals(buffer,"tEXt");
        if (uVar1 == '\0') {
          uVar1 = lodepng_chunk_type_equals(buffer,"zTXt");
          if (uVar1 == '\0') {
            uVar1 = lodepng_chunk_type_equals(buffer,"iTXt");
            if (uVar1 == '\0') {
              uVar1 = lodepng_chunk_type_equals(buffer,"tIME");
              if (uVar1 == '\0') {
                uVar1 = lodepng_chunk_type_equals(buffer,"pHYs");
                if (uVar1 == '\0') {
                  uVar1 = lodepng_chunk_type_equals(buffer,"gAMA");
                  if (uVar1 == '\0') {
                    uVar1 = lodepng_chunk_type_equals(buffer,"cHRM");
                    if (uVar1 == '\0') {
                      uVar1 = lodepng_chunk_type_equals(buffer,"sRGB");
                      if (uVar1 != '\0') {
                        if (uVar2 != 1) {
                          return 0x62;
                        }
                        (state->info_png).srgb_defined = 1;
                        (state->info_png).srgb_intent = (uint)*data;
                        goto LAB_0011b70e;
                      }
                      uVar1 = lodepng_chunk_type_equals(buffer,"iCCP");
                      if (uVar1 == '\0') {
                        return 0;
                      }
                      uVar2 = readChunk_iCCP(&state->info_png,(LodePNGDecompressSettings *)state,
                                             data,chunkLength);
                    }
                    else {
                      uVar2 = readChunk_cHRM(&state->info_png,data,chunkLength);
                    }
                  }
                  else {
                    uVar2 = readChunk_gAMA(&state->info_png,data,chunkLength);
                  }
                }
                else {
                  uVar2 = readChunk_pHYs(&state->info_png,data,chunkLength);
                }
              }
              else {
                uVar2 = readChunk_tIME(&state->info_png,data,chunkLength);
              }
            }
            else {
              uVar2 = readChunk_iTXt(&state->info_png,(LodePNGDecompressSettings *)state,data,
                                     chunkLength);
            }
          }
          else {
            uVar2 = readChunk_zTXt(&state->info_png,(LodePNGDecompressSettings *)state,data,
                                   chunkLength);
          }
        }
        else {
          uVar2 = readChunk_tEXt(&state->info_png,data,chunkLength);
        }
      }
      else {
        uVar2 = readChunk_bKGD(&state->info_png,data,chunkLength);
      }
    }
    else {
      uVar2 = readChunk_tRNS(&(state->info_png).color,data,chunkLength);
    }
  }
  else {
    uVar2 = readChunk_PLTE(&(state->info_png).color,data,chunkLength);
  }
  if (uVar2 != 0) {
    return uVar2;
  }
LAB_0011b70e:
  if ((state->decoder).ignore_crc != 0) {
    return 0;
  }
  uVar2 = lodepng_chunk_check_crc(buffer);
  if (uVar2 == 0) {
    return 0;
  }
  return 0x39;
}

Assistant:

unsigned lodepng_inspect_chunk(LodePNGState* state, size_t pos,
                               const unsigned char* in, size_t insize) {
  const unsigned char* chunk = in + pos;
  unsigned chunkLength;
  const unsigned char* data;
  unsigned unhandled = 0;
  unsigned error = 0;

  if(pos + 4 > insize) return 30;
  chunkLength = lodepng_chunk_length(chunk);
  if(chunkLength > 2147483647) return 63;
  data = lodepng_chunk_data_const(chunk);
  if(data + chunkLength + 4 > in + insize) return 30;

  if(lodepng_chunk_type_equals(chunk, "PLTE")) {
    error = readChunk_PLTE(&state->info_png.color, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "tRNS")) {
    error = readChunk_tRNS(&state->info_png.color, data, chunkLength);
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
  } else if(lodepng_chunk_type_equals(chunk, "bKGD")) {
    error = readChunk_bKGD(&state->info_png, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "tEXt")) {
    error = readChunk_tEXt(&state->info_png, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "zTXt")) {
    error = readChunk_zTXt(&state->info_png, &state->decoder.zlibsettings, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "iTXt")) {
    error = readChunk_iTXt(&state->info_png, &state->decoder.zlibsettings, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "tIME")) {
    error = readChunk_tIME(&state->info_png, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "pHYs")) {
    error = readChunk_pHYs(&state->info_png, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "gAMA")) {
    error = readChunk_gAMA(&state->info_png, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "cHRM")) {
    error = readChunk_cHRM(&state->info_png, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "sRGB")) {
    error = readChunk_sRGB(&state->info_png, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "iCCP")) {
    error = readChunk_iCCP(&state->info_png, &state->decoder.zlibsettings, data, chunkLength);
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
  } else {
    /* unhandled chunk is ok (is not an error) */
    unhandled = 1;
  }

  if(!error && !unhandled && !state->decoder.ignore_crc) {
    if(lodepng_chunk_check_crc(chunk)) return 57; /*invalid CRC*/
  }

  return error;
}